

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_reader.hpp
# Opt level: O2

error_or_n<int,_gsl::span<typename_span<unsigned_char,__1L>::element_type>_> * __thiscall
pstore::http::
buffered_reader<int,std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>(int,pstore::gsl::span<unsigned_char,-1l>const&)>>
::get_span<pstore::gsl::span<unsigned_char,_1l>>
          (error_or_n<int,_gsl::span<typename_span<unsigned_char,__1L>::element_type>_>
           *__return_storage_ptr__,
          buffered_reader<int,std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>>
          *this,int io,span<unsigned_char,__1L> *sp)

{
  undefined4 in_register_00000014;
  span<unsigned_char,__1L> s;
  anon_class_1_0_00000001 cast;
  anon_class_1_0_00000001 local_51;
  error_or_n<int,_byte_span> local_50;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_30;
  
  s.storage_.data_._4_4_ = in_register_00000014;
  s.storage_.data_._0_4_ = io;
  s.storage_.super_extent_type<_1L>.size_ = (index_type)(sp->storage_).data_;
  local_30 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
             pstore::gsl::as_writeable_bytes<unsigned_char,_1l,void>
                       ((gsl *)(sp->storage_).super_extent_type<_1L>.size_,s);
  buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>_>
  ::get_span_impl(&local_50,
                  (buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
                   *)this,io,(byte_span *)&local_30);
  pstore::operator>>=(__return_storage_ptr__,&local_50,&local_51);
  error_or<std::tuple<int,_pstore::gsl::span<unsigned_char,_-1L>_>_>::~error_or(&local_50);
  return __return_storage_ptr__;
}

Assistant:

auto buffered_reader<IO, RefillFunction>::get_span (IO io, SpanType const & sp)
            -> error_or_n<IO, gsl::span<typename SpanType::element_type>> {

            auto cast = [] (IO io2, byte_span const & sp2) {
                using element_type = typename SpanType::element_type;
                using index_type = typename SpanType::index_type;
                auto const first = reinterpret_cast<element_type *> (sp2.data ());
                auto const elements =
                    std::max (sp2.size (), index_type{0}) / index_type{sizeof (element_type)};
                return error_or_n<IO, gsl::span<element_type>>{
                    in_place, io2, gsl::make_span (first, first + elements)};
            };
            return this->get_span_impl (io, as_writeable_bytes (sp)) >>= cast;
        }